

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseFalse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          VWReaderHandler<true> *handler)

{
  Ch CVar1;
  bool bVar2;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *in_RSI;
  ParseErrorCode in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar3;
  
  GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
  CVar1 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
  if (CVar1 == 'a') {
    GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
  }
  uVar3 = false;
  if (CVar1 == 'a') {
    CVar1 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
    if (CVar1 == 'l') {
      GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
    }
    uVar3 = false;
    if (CVar1 == 'l') {
      CVar1 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
      if (CVar1 == 's') {
        GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
      }
      uVar3 = false;
      if (CVar1 == 's') {
        CVar1 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
        uVar3 = CVar1 == 'e';
        if ((bool)uVar3) {
          GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
        }
      }
    }
  }
  if ((bool)uVar3 == false) {
    GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)CONCAT17(uVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c,0x26aaa0);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)0x26aaac);
  }
  else {
    bVar2 = VWReaderHandler<true>::Bool
                      ((VWReaderHandler<true> *)CONCAT17(uVar3,in_stack_ffffffffffffff90),
                       SUB41(in_stack_ffffffffffffff8c >> 0x18,0));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)CONCAT17(uVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c,0x26aa60)
      ;
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)0x26aa6c);
    }
  }
  return;
}

Assistant:

void ParseFalse(InputStream& is, Handler& handler)
  { RAPIDJSON_ASSERT(is.Peek() == 'f');
    is.Take();

    if (RAPIDJSON_LIKELY(Consume(is, 'a') && Consume(is, 'l') && Consume(is, 's') && Consume(is, 'e')))
    { if (RAPIDJSON_UNLIKELY(!handler.Bool(false)))
        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
    }
    else
      RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
  }